

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O2

void uo_cb_append_cb(uo_cb *cb,uo_cb *cb_after)

{
  uint64_t n;
  void **__src;
  size_t sVar1;
  uint64_t uVar2;
  void **__ptr;
  size_t sVar3;
  uo_linklist *puVar4;
  
  __src = (cb_after->stack).items;
  sVar1 = (cb_after->stack).count;
  __ptr = (cb->stack).items;
  sVar3 = (cb->stack).count;
  n = sVar3 + sVar1;
  if ((cb->stack).capacity < n) {
    uVar2 = next_power_of_two(n);
    (cb->stack).capacity = uVar2;
    __ptr = (void **)realloc(__ptr,uVar2 * 8);
    (cb->stack).items = __ptr;
    sVar3 = (cb->stack).count;
  }
  memmove(__ptr + sVar1,__ptr,sVar3 << 3);
  memcpy((cb->stack).items,__src,sVar1 << 3);
  (cb->stack).count = n;
  puVar4 = &cb_after->funclist;
  while (puVar4 = puVar4->next, puVar4 != &cb_after->funclist) {
    uo_cb_append_func(cb,(uo_cb_func)puVar4[1].next);
  }
  return;
}

Assistant:

void uo_cb_append_cb(
    uo_cb *cb,
    uo_cb *cb_after)
{
    uo_stack_insert_arr(&cb->stack, 0, cb_after->stack.items, cb_after->stack.count);

    uo_linklist *link = cb_after->funclist.next;

    while (link != &cb_after->funclist)
    {
        uo_cb_append_func(cb, ((uo_cb_func_linklist *)link)->item);
        link = link->next;
    }
}